

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O3

void pile_excise(object **pile,object *obj)

{
  wchar_t line;
  undefined8 in_RCX;
  object *poVar1;
  object *poVar2;
  undefined8 in_RDX;
  object *poVar3;
  object *extraout_RDX;
  object *extraout_RDX_00;
  object *extraout_RDX_01;
  object *extraout_RDX_02;
  object *pile_00;
  object *poVar4;
  bool bVar5;
  bool bVar6;
  
  poVar4 = *pile;
  bVar5 = poVar4 == (object *)0x0;
  bVar6 = !bVar5;
  poVar1 = (object *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
  poVar3 = (object *)CONCAT71((int7)((ulong)in_RDX >> 8),poVar4 == obj || bVar5);
  poVar2 = poVar4;
  if (poVar4 != obj && !bVar5) {
    do {
      poVar1 = poVar2->next;
      bVar6 = poVar1 != (object *)0x0;
      if (poVar1 == obj) break;
      poVar2 = poVar1;
    } while (poVar1 != (object *)0x0);
  }
  line = (wchar_t)poVar1;
  poVar1 = obj->prev;
  poVar2 = obj->next;
  pile_00 = obj;
  if (!bVar6) {
    pile_integrity_fail(poVar4,obj,(char *)0xd7,line);
    poVar4 = *pile;
    poVar3 = extraout_RDX;
  }
  pile_check_integrity((char *)poVar4,pile_00,poVar3);
  poVar4 = *pile;
  poVar3 = extraout_RDX_00;
  if (poVar4 == obj) {
    if (poVar1 != (object *)0x0) {
      pile_00 = obj;
      pile_integrity_fail(poVar4,obj,(char *)0xde,line);
      poVar3 = extraout_RDX_02;
    }
    *pile = poVar2;
  }
  else {
    if (obj->prev == (object *)0x0) {
      pile_00 = obj;
      pile_integrity_fail(poVar4,obj,(char *)0xe4,line);
      poVar3 = extraout_RDX_01;
    }
    poVar1->next = poVar2;
    obj->prev = (object *)0x0;
  }
  if (poVar2 != (object *)0x0) {
    poVar2->prev = poVar1;
    obj->next = (object *)0x0;
  }
  pile_check_integrity((char *)*pile,pile_00,poVar3);
  return;
}

Assistant:

void pile_excise(struct object **pile, struct object *obj)
{
	struct object *prev = obj->prev;
	struct object *next = obj->next;

	if (!pile_contains(*pile, obj)) {
		pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
	}
	pile_check_integrity("excise [pre]", *pile, obj);

	/* Special case: unlink top object */
	if (*pile == obj) {
		if (prev) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		*pile = next;
	} else {
		if (obj->prev == NULL) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		/* Otherwise unlink from the previous */
		prev->next = next;
		obj->prev = NULL;
	}

	/* And then unlink from the next */
	if (next) {
		next->prev = prev;
		obj->next = NULL;
	}

	pile_check_integrity("excise [post]", *pile, NULL);
}